

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CEException.cpp
# Opt level: O2

bool __thiscall test_CEException::test_invalid_value(test_CEException *this)

{
  invalid_value *this_00;
  allocator local_6e [2];
  allocator local_6c [4];
  string local_68;
  string local_48;
  
  this_00 = (invalid_value *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_68,"test_CEException::test_invalid_value()",local_6c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_48,"Testing throwing \'CEException::invalid_value\'",local_6e);
  CEException::invalid_value::invalid_value(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&CEException::invalid_value::typeinfo,CEExceptionHandler::~CEExceptionHandler)
  ;
}

Assistant:

bool test_CEException::test_invalid_value(void)
{
    // Try throwing
    try {
        throw CEException::invalid_value("test_CEException::test_invalid_value()",
                                         "Testing throwing 'CEException::invalid_value'");
        // If we get here there's a problem
        log_failure("CEException::invalid_value failed to throw", __func__, __LINE__);
        update_pass(false);
    } catch (CEException::invalid_value & e) {
        // This is where we should be
        log_success("CEException::invalid_value thrown successfully", __func__, __LINE__);
        update_pass(true);
    }

    return pass();
}